

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O1

void monster_remove_from_targets(chunk *c,monster_conflict *mon)

{
  wchar_t wVar1;
  wchar_t wVar2;
  monster *pmVar3;
  
  wVar1 = cave_monster_max((chunk_conflict *)c);
  if (L'\x01' < wVar1) {
    wVar1 = L'\x01';
    do {
      pmVar3 = cave_monster((chunk_conflict *)c,wVar1);
      if ((pmVar3->race != (monster_race *)0x0) && ((pmVar3->target).midx == mon->midx)) {
        (pmVar3->target).midx = 0;
      }
      wVar1 = wVar1 + L'\x01';
      wVar2 = cave_monster_max((chunk_conflict *)c);
    } while (wVar1 < wVar2);
  }
  return;
}

Assistant:

void monster_remove_from_targets(struct chunk *c, struct monster *mon)
{
	int i;
	for (i = 1; i < cave_monster_max(c); i++) {
		struct monster *mon1 = cave_monster(c, i);
		if (!mon1->race) continue;
		if (mon1->target.midx == mon->midx) {
			mon1->target.midx = 0;
		}
	}
}